

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTransformedLp.cpp
# Opt level: O1

bool __thiscall
HighsTransformedLp::untransform
          (HighsTransformedLp *this,vector<double,_std::allocator<double>_> *vals,
          vector<int,_std::allocator<int>_> *inds,double *rhs,bool integral)

{
  HighsSparseVectorSum *pHVar1;
  int iVar2;
  pointer ppVar3;
  pointer piVar4;
  pointer pHVar5;
  HighsOptions *pHVar6;
  _Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_> _Var7;
  pointer pdVar8;
  bool bVar9;
  vector<int,_std::allocator<int>_> *pvVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  undefined7 in_register_00000081;
  long lVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  HighsInt rowlen;
  double *rowvals;
  HighsInt *rowinds;
  double local_98;
  double local_90;
  uint local_84;
  undefined4 local_80;
  int local_7c;
  vector<int,_std::allocator<int>_> *local_78;
  double local_70;
  HighsMipSolver *local_68;
  double *local_60;
  HighsInt *local_58;
  double *local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_80 = (undefined4)CONCAT71(in_register_00000081,integral);
  local_98 = *rhs;
  local_68 = this->lprelaxation->mipsolver;
  uVar13 = (long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_78 = inds;
  local_50 = rhs;
  if ((uVar13 & 0x3fffffffc) == 0) {
    local_90 = 0.0;
  }
  else {
    local_7c = local_68->model_->num_col_;
    pHVar1 = &this->vectorsum;
    uVar18 = 0;
    local_90 = 0.0;
    dVar19 = local_98;
    do {
      dVar21 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar18];
      local_98 = dVar19;
      if ((dVar21 == 0.0) && (!NAN(dVar21))) goto switchD_002f58be_default;
      iVar14 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar18];
      lVar16 = (long)iVar14;
      switch((this->boundTypes).
             super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar16]) {
      case kSimpleUb:
        if (iVar14 < local_7c) {
          dVar20 = *(double *)
                    (*(long *)((long)(local_68->mipdata_)._M_t.
                                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                     .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6b0) +
                    lVar16 * 8) * dVar21;
          local_98 = dVar19 - dVar20;
          dVar19 = (dVar19 - (dVar20 + local_98)) + (-dVar20 - (local_98 - (dVar20 + local_98)));
          dVar21 = -dVar21;
LAB_002f5a99:
          local_90 = local_90 + dVar19;
          HighsSparseVectorSum::add(pHVar1,iVar14,dVar21);
        }
        else {
          uStack_40 = 0;
          iVar14 = iVar14 - local_7c;
          local_48 = dVar21;
          local_70 = HighsLpRelaxation::slackUpper(this->lprelaxation,iVar14);
          pdVar8 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8[uVar18] = -pdVar8[uVar18];
          HighsLpRelaxation::LpRow::get
                    ((this->lprelaxation->lprows).
                     super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar14,
                     this->lprelaxation->mipsolver,(HighsInt *)&local_84,&local_58,&local_60);
          if (local_84 != 0) {
            uVar15 = 0;
            do {
              HighsSparseVectorSum::add
                        (pHVar1,local_58[uVar15],
                         (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar18] * local_60[uVar15]);
              uVar15 = uVar15 + 1;
            } while (uVar15 != local_84);
          }
          dVar21 = local_48 * local_70;
          local_98 = dVar19 - dVar21;
          local_90 = local_90 +
                     (dVar19 - (dVar21 + local_98)) + (-dVar21 - (local_98 - (dVar21 + local_98)));
        }
        break;
      case kSimpleLb:
        if (iVar14 < local_7c) {
          dVar20 = *(double *)
                    (*(long *)((long)(local_68->mipdata_)._M_t.
                                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                     .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x698) +
                    lVar16 * 8) * dVar21;
          local_98 = dVar19 + dVar20;
          dVar19 = (dVar19 - (local_98 - dVar20)) + (dVar20 - (local_98 - (local_98 - dVar20)));
          goto LAB_002f5a99;
        }
        uStack_40 = 0;
        iVar14 = iVar14 - local_7c;
        local_48 = dVar21;
        local_70 = HighsLpRelaxation::slackLower(this->lprelaxation,iVar14);
        HighsLpRelaxation::LpRow::get
                  ((this->lprelaxation->lprows).
                   super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar14,this->lprelaxation->mipsolver,
                   (HighsInt *)&local_84,&local_58,&local_60);
        if (local_84 != 0) {
          uVar15 = 0;
          do {
            HighsSparseVectorSum::add
                      (pHVar1,local_58[uVar15],
                       (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar18] * local_60[uVar15]);
            uVar15 = uVar15 + 1;
          } while (uVar15 != local_84);
        }
        dVar21 = local_48 * local_70;
        local_98 = dVar19 + dVar21;
        local_90 = local_90 +
                   (dVar19 - (local_98 - dVar21)) + (dVar21 - (local_98 - (local_98 - dVar21)));
        break;
      case kVariableUb:
        ppVar3 = (this->bestVub).
                 super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        dVar20 = ppVar3[lVar16].second.constant * dVar21;
        local_98 = dVar19 - dVar20;
        dVar20 = (dVar19 - (dVar20 + local_98)) + (-dVar20 - (local_98 - (dVar20 + local_98)));
        HighsSparseVectorSum::add(pHVar1,ppVar3[lVar16].first,dVar21 * ppVar3[lVar16].second.coef);
        dVar19 = -(vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar18];
        goto LAB_002f5a1d;
      case kVariableLb:
        ppVar3 = (this->bestVlb).
                 super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        dVar20 = ppVar3[lVar16].second.constant * dVar21;
        local_98 = dVar19 + dVar20;
        dVar20 = (dVar19 - (local_98 - dVar20)) + (dVar20 - (local_98 - (local_98 - dVar20)));
        HighsSparseVectorSum::add(pHVar1,ppVar3[lVar16].first,-dVar21 * ppVar3[lVar16].second.coef);
        dVar19 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar18];
LAB_002f5a1d:
        local_90 = local_90 + dVar20;
        HighsSparseVectorSum::add(pHVar1,iVar14,dVar19);
      }
switchD_002f58be_default:
      uVar18 = uVar18 + 1;
      dVar19 = local_98;
    } while (uVar18 != (uVar13 >> 2 & 0xffffffff));
  }
  if ((char)local_80 == '\0') {
    piVar4 = (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = (ulong)((long)(this->vectorsum).nonzeroinds.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar4) >> 2;
    uVar11 = (uint)uVar13;
    if ((int)uVar11 < 1) {
      bVar9 = false;
    }
    else {
      pHVar5 = (this->vectorsum).values.
               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_start;
      pHVar6 = local_68->options_mip_;
      lVar16 = (ulong)(uVar11 & 0x7fffffff) + 1;
      bVar9 = false;
      do {
        iVar14 = piVar4[lVar16 + -2];
        lVar17 = (long)iVar14;
        dVar19 = pHVar5[lVar17].hi + pHVar5[lVar17].lo;
        if (ABS(dVar19) <= (pHVar6->super_HighsOptionsStruct).small_matrix_value) {
LAB_002f5e83:
          iVar12 = (int)uVar13;
          uVar13 = (ulong)(iVar12 - 1);
          pHVar5[lVar17].hi = 0.0;
          pHVar5[lVar17].lo = 0.0;
          iVar2 = piVar4[(long)iVar12 + -1];
          piVar4[(long)iVar12 + -1] = iVar14;
          piVar4[lVar16 + -2] = iVar2;
        }
        else {
          _Var7.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl =
               (local_68->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>;
          if (ABS(dVar19) <=
              *(double *)
               ((long)_Var7.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl + 0x6620
               )) {
            if (dVar19 <= 0.0) {
              dVar21 = *(double *)
                        (*(long *)((long)_Var7.super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                         _M_head_impl + 0x6b0) + lVar17 * 8);
              if (INFINITY <= dVar21) goto LAB_002f5e80;
            }
            else {
              dVar21 = *(double *)
                        (*(long *)((long)_Var7.super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                         _M_head_impl + 0x698) + lVar17 * 8);
              if (dVar21 <= -INFINITY) {
LAB_002f5e80:
                bVar9 = true;
                goto LAB_002f5e83;
              }
            }
            dVar19 = dVar19 * dVar21;
            dVar21 = local_98 - dVar19;
            local_90 = local_90 +
                       (local_98 - (dVar19 + dVar21)) + (-dVar19 - (dVar21 - (dVar19 + dVar21)));
            local_98 = dVar21;
            goto LAB_002f5e83;
          }
        }
        uVar11 = (uint)uVar13;
        lVar16 = lVar16 + -1;
      } while (1 < lVar16);
    }
    std::vector<int,_std::allocator<int>_>::resize(&(this->vectorsum).nonzeroinds,(long)(int)uVar11)
    ;
    if (bVar9) {
      HighsSparseVectorSum::clear(&this->vectorsum);
      return false;
    }
    *local_50 = local_90 + local_98;
  }
  else {
    piVar4 = (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = (ulong)((long)(this->vectorsum).nonzeroinds.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar4) >> 2;
    uVar11 = (uint)uVar13;
    if (0 < (int)uVar11) {
      pHVar5 = (this->vectorsum).values.
               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar16 = (ulong)(uVar11 & 0x7fffffff) + 1;
      do {
        iVar14 = piVar4[lVar16 + -2];
        if (ABS(pHVar5[iVar14].hi + pHVar5[iVar14].lo) < 0.5) {
          iVar12 = (int)uVar13;
          uVar13 = (ulong)(iVar12 - 1);
          pHVar5[iVar14].hi = 0.0;
          pHVar5[iVar14].lo = 0.0;
          iVar2 = piVar4[(long)iVar12 + -1];
          piVar4[(long)iVar12 + -1] = iVar14;
          piVar4[lVar16 + -2] = iVar2;
        }
        uVar11 = (uint)uVar13;
        lVar16 = lVar16 + -1;
      } while (1 < lVar16);
    }
    std::vector<int,_std::allocator<int>_>::resize(&(this->vectorsum).nonzeroinds,(long)(int)uVar11)
    ;
    dVar19 = round(local_90 + local_98);
    *local_50 = dVar19;
  }
  pvVar10 = local_78;
  pHVar1 = &this->vectorsum;
  std::vector<int,_std::allocator<int>_>::operator=(local_78,&(this->vectorsum).nonzeroinds);
  uVar18 = (long)(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  uVar13 = uVar18 >> 2;
  std::vector<double,_std::allocator<double>_>::resize(vals,(long)(int)uVar13);
  if ((char)local_80 == '\0') {
    if ((uVar18 & 0x3fffffffc) != 0) {
      piVar4 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pHVar5 = (pHVar1->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar8 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = 0;
      do {
        iVar14 = piVar4[uVar18];
        pdVar8[uVar18] = pHVar5[iVar14].hi + pHVar5[iVar14].lo;
        uVar18 = uVar18 + 1;
      } while ((uVar13 & 0xffffffff) != uVar18);
    }
  }
  else if ((uVar18 & 0x3fffffffc) != 0) {
    piVar4 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pHVar5 = (pHVar1->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar8 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar18 = 0;
    do {
      iVar14 = piVar4[uVar18];
      dVar19 = round(pHVar5[iVar14].hi + pHVar5[iVar14].lo);
      pdVar8[uVar18] = dVar19;
      uVar18 = uVar18 + 1;
    } while ((uVar13 & 0xffffffff) != uVar18);
  }
  HighsSparseVectorSum::clear(pHVar1);
  return true;
}

Assistant:

bool HighsTransformedLp::untransform(std::vector<double>& vals,
                                     std::vector<HighsInt>& inds, double& rhs,
                                     bool integral) {
  HighsCDouble tmpRhs = rhs;
  const HighsMipSolver& mip = lprelaxation.getMipSolver();
  const HighsInt slackOffset = mip.numCol();

  HighsInt numNz = inds.size();

  for (HighsInt i = 0; i != numNz; ++i) {
    if (vals[i] == 0.0) continue;
    HighsInt col = inds[i];

    switch (boundTypes[col]) {
      case BoundType::kVariableLb: {
        tmpRhs += bestVlb[col].second.constant * vals[i];
        vectorsum.add(bestVlb[col].first, -vals[i] * bestVlb[col].second.coef);
        vectorsum.add(col, vals[i]);
        break;
      }
      case BoundType::kVariableUb: {
        tmpRhs -= bestVub[col].second.constant * vals[i];
        vectorsum.add(bestVub[col].first, vals[i] * bestVub[col].second.coef);
        vectorsum.add(col, -vals[i]);
        break;
      }
      case BoundType::kSimpleLb: {
        if (col < slackOffset) {
          tmpRhs += vals[i] * mip.mipdata_->domain.col_lower_[col];
          vectorsum.add(col, vals[i]);
        } else {
          HighsInt row = col - slackOffset;
          tmpRhs += vals[i] * lprelaxation.slackLower(row);

          HighsInt rowlen;
          const HighsInt* rowinds;
          const double* rowvals;
          lprelaxation.getRow(row, rowlen, rowinds, rowvals);

          for (HighsInt j = 0; j != rowlen; ++j)
            vectorsum.add(rowinds[j], vals[i] * rowvals[j]);
        }
        break;
      }
      case BoundType::kSimpleUb: {
        if (col < slackOffset) {
          tmpRhs -= vals[i] * mip.mipdata_->domain.col_upper_[col];
          vectorsum.add(col, -vals[i]);
        } else {
          HighsInt row = col - slackOffset;
          tmpRhs -= vals[i] * lprelaxation.slackUpper(row);
          vals[i] = -vals[i];

          HighsInt rowlen;
          const HighsInt* rowinds;
          const double* rowvals;
          lprelaxation.getRow(row, rowlen, rowinds, rowvals);

          for (HighsInt j = 0; j != rowlen; ++j)
            vectorsum.add(rowinds[j], vals[i] * rowvals[j]);
        }
      }
    }
  }

  if (integral) {
    // if the cut is integral, we just round all coefficient values and the
    // right hand side to the nearest integral value, as small deviation
    // only come from numerical errors during resubstitution of slack variables

    auto IsZero = [&](HighsInt col, double val) {
      assert(col < mip.numCol());
      return fabs(val) < 0.5;
    };

    vectorsum.cleanup(IsZero);
    rhs = std::round(double(tmpRhs));
  } else {
    bool abort = false;
    auto IsZero = [&](HighsInt col, double val) {
      assert(col < mip.numCol());
      double absval = std::abs(val);
      if (absval <= mip.options_mip_->small_matrix_value) return true;

      if (absval <= mip.mipdata_->feastol) {
        if (val > 0) {
          if (mip.mipdata_->domain.col_lower_[col] == -kHighsInf)
            abort = true;
          else
            tmpRhs -= val * mip.mipdata_->domain.col_lower_[col];
        } else {
          if (mip.mipdata_->domain.col_upper_[col] == kHighsInf)
            abort = true;
          else
            tmpRhs -= val * mip.mipdata_->domain.col_upper_[col];
        }
        return true;
      }
      return false;
    };

    vectorsum.cleanup(IsZero);
    if (abort) {
      vectorsum.clear();
      return false;
    }
    rhs = double(tmpRhs);
  }

  inds = vectorsum.getNonzeros();
  numNz = inds.size();
  vals.resize(numNz);

  if (integral)
    for (HighsInt i = 0; i != numNz; ++i)
      vals[i] = std::round(vectorsum.getValue(inds[i]));
  else
    for (HighsInt i = 0; i != numNz; ++i) vals[i] = vectorsum.getValue(inds[i]);
  vectorsum.clear();

  return true;
}